

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__fill_gif_background(stbi__gif *g,int x0,int y0,int x1,int y1)

{
  int iVar1;
  stbi_uc *psVar2;
  long lVar3;
  long lVar4;
  
  if (y0 < y1) {
    iVar1 = g->bgindex;
    do {
      if (x0 < x1) {
        lVar4 = (long)y0 + 3;
        lVar3 = (long)x0;
        do {
          psVar2 = g->out;
          psVar2[lVar3 + -3 + lVar4] = g->pal[iVar1][2];
          psVar2[lVar3 + -2 + lVar4] = g->pal[iVar1][1];
          psVar2[lVar3 + -1 + lVar4] = g->pal[iVar1][0];
          psVar2[lVar3 + lVar4] = '\0';
          lVar3 = lVar3 + 4;
        } while (lVar3 < x1);
      }
      y0 = y0 + g->w * 4;
    } while (y0 < y1);
  }
  return;
}

Assistant:

static void stbi__fill_gif_background(stbi__gif *g, int x0, int y0, int x1, int y1)
{
   int x, y;
   stbi_uc *c = g->pal[g->bgindex];
   for (y = y0; y < y1; y += 4 * g->w) {
      for (x = x0; x < x1; x += 4) {
         stbi_uc *p  = &g->out[y + x];
         p[0] = c[2];
         p[1] = c[1];
         p[2] = c[0];
         p[3] = 0;
      }
   }
}